

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_integer.c
# Opt level: O3

int aom_uleb_decode(uint8_t *buffer,size_t available,uint64_t *value,size_t *length)

{
  byte bVar1;
  size_t sVar2;
  size_t sVar3;
  uint64_t uVar4;
  bool bVar5;
  
  if (value != (uint64_t *)0x0 && buffer != (uint8_t *)0x0) {
    *value = 0;
    sVar3 = 8;
    if (available < 8) {
      sVar3 = available;
    }
    if (available != 0) {
      bVar1 = 0;
      uVar4 = 0;
      sVar2 = 1;
      do {
        uVar4 = (ulong)(buffer[sVar2 - 1] & 0x7f) << (bVar1 & 0x3f) | uVar4;
        *value = uVar4;
        if (-1 < (char)buffer[sVar2 - 1]) {
          if (length != (size_t *)0x0) {
            *length = sVar2;
            uVar4 = *value;
          }
          return -(uint)(uVar4 >> 0x20 != 0);
        }
        bVar1 = bVar1 + 7;
        bVar5 = sVar2 != sVar3;
        sVar2 = sVar2 + 1;
      } while (bVar5);
    }
  }
  return -1;
}

Assistant:

int aom_uleb_decode(const uint8_t *buffer, size_t available, uint64_t *value,
                    size_t *length) {
  if (buffer && value) {
    *value = 0;
    for (size_t i = 0; i < kMaximumLeb128Size && i < available; ++i) {
      const uint8_t decoded_byte = *(buffer + i) & kLeb128ByteMask;
      *value |= ((uint64_t)decoded_byte) << (i * 7);
      if ((*(buffer + i) >> 7) == 0) {
        if (length) {
          *length = i + 1;
        }

        // Fail on values larger than 32-bits to ensure consistent behavior on
        // 32 and 64 bit targets: value is typically used to determine buffer
        // allocation size.
        if (*value > UINT32_MAX) return -1;

        return 0;
      }
    }
  }

  // If we get here, either the buffer/value pointers were invalid,
  // or we ran over the available space
  return -1;
}